

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderGrid.cpp
# Opt level: O0

void __thiscall OrderGrid::incDec(OrderGrid *this,int amount)

{
  int iVar1;
  iterator __first;
  iterator __last;
  reference id;
  anon_class_4_1_4cde4196 local_1c;
  array<unsigned_char,_4UL> local_18;
  anon_class_4_1_4cde4196 addId;
  OrderRow row;
  int amount_local;
  OrderGrid *this_local;
  
  addId.amount = amount;
  local_18._M_elems = (_Type)PatternModel::currentOrderRow(this->mModel);
  local_1c.amount = addId.amount;
  if ((this->mChangeAll & 1U) == 0) {
    iVar1 = PatternModel::cursorTrack(this->mModel);
    id = std::array<unsigned_char,_4UL>::operator[](&local_18,(long)iVar1);
    incDec::anon_class_4_1_4cde4196::operator()(&local_1c,id);
  }
  else {
    __first = std::array<unsigned_char,_4UL>::begin(&local_18);
    __last = std::array<unsigned_char,_4UL>::end(&local_18);
    std::for_each<unsigned_char*,OrderGrid::incDec(int)::__0>(__first,__last,local_1c);
  }
  PatternModel::setOrderRow(this->mModel,(OrderRow)local_18._M_elems);
  return;
}

Assistant:

void OrderGrid::incDec(int amount) {
    auto row = mModel.currentOrderRow();

    auto addId = [amount](uint8_t &id) {
        id = (uint8_t)std::clamp((int)id + amount, 0, 0xFF);
    };
    
    if (mChangeAll) {
        std::for_each(row.begin(), row.end(), addId);
    } else {
        addId(row[mModel.cursorTrack()]);
    }

    mModel.setOrderRow(row);
}